

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::IsTreatedAsSmartList
          (MessageDifferencer *this,FieldDescriptor *field)

{
  bool bVar1;
  MappedReference<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>
  pRVar2;
  MapKeyComparator *pMVar3;
  bool local_49;
  iterator local_40;
  iterator local_30;
  FieldDescriptor *local_20;
  FieldDescriptor *field_local;
  MessageDifferencer *this_local;
  
  local_20 = field;
  field_local = (FieldDescriptor *)this;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    local_30 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>>>
               ::find<google::protobuf::FieldDescriptor_const*>
                         ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>>>
                           *)&this->repeated_field_comparisons_,&local_20);
    local_40 = absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
               ::end((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>_>_>
                      *)&this->repeated_field_comparisons_);
    bVar1 = absl::lts_20250127::container_internal::operator!=(&local_30,&local_40);
    if (bVar1) {
      pRVar2 = absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>>>
               ::
               operator[]<google::protobuf::FieldDescriptor_const*,absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>>
                         ((raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,google::protobuf::util::MessageDifferencer::RepeatedFieldComparison>>>
                           *)&this->repeated_field_comparisons_,&local_20);
      this_local._7_1_ = *pRVar2 == AS_SMART_LIST;
    }
    else {
      pMVar3 = GetMapKeyComparator(this,local_20);
      local_49 = false;
      if (pMVar3 == (MapKeyComparator *)0x0) {
        local_49 = this->repeated_field_comparison_ == AS_SMART_LIST;
      }
      this_local._7_1_ = local_49;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageDifferencer::IsTreatedAsSmartList(const FieldDescriptor* field) {
  if (!field->is_repeated()) return false;
  if (repeated_field_comparisons_.find(field) !=
      repeated_field_comparisons_.end()) {
    return repeated_field_comparisons_[field] == AS_SMART_LIST;
  }
  return GetMapKeyComparator(field) == nullptr &&
         repeated_field_comparison_ == AS_SMART_LIST;
}